

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O0

ostream * testing::operator<<(ostream *os,Message *sb)

{
  ostream *poVar1;
  String local_28;
  Message *local_18;
  Message *sb_local;
  ostream *os_local;
  
  local_18 = sb;
  sb_local = (Message *)os;
  Message::GetString((Message *)&local_28);
  poVar1 = internal::operator<<(os,&local_28);
  internal::String::~String((String *)os);
  return poVar1;
}

Assistant:

inline std::ostream& operator <<(std::ostream& os, const Message& sb) {
  return os << sb.GetString();
}